

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridDataType0.cpp
# Opt level: O1

void __thiscall
KDIS::DATA_TYPE::GridDataType0::GridDataType0
          (GridDataType0 *this,KUINT16 SampleType,KUINT8 *Data,KUINT16 NumBytes)

{
  pointer *ppuVar1;
  iterator __position;
  undefined2 in_register_0000000a;
  ulong uVar2;
  
  GridData::GridData(&this->super_GridData);
  (this->super_GridData).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__GridDataType0_00224c08;
  *(KUINT16 *)&(this->super_GridData).field_0xc = NumBytes;
  (this->m_vui8DataVals).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vui8DataVals).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->m_vui8DataVals).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->m_vui8DataVals).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  (this->super_GridData).m_ui16SmpTyp = SampleType;
  (this->super_GridData).m_ui16DtRep = 0;
  if (CONCAT22(in_register_0000000a,NumBytes) != 0) {
    uVar2 = 0;
    do {
      __position._M_current =
           (this->m_vui8DataVals).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->m_vui8DataVals).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_realloc_insert<unsigned_char_const&>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&this->m_vui8DataVals,
                   __position,Data + uVar2);
      }
      else {
        *__position._M_current = Data[uVar2];
        ppuVar1 = &(this->m_vui8DataVals).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppuVar1 = *ppuVar1 + 1;
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < *(ushort *)&(this->super_GridData).field_0xc);
  }
  return;
}

Assistant:

GridDataType0::GridDataType0( KUINT16 SampleType, KUINT8 * Data, KUINT16 NumBytes ) :
    m_ui16NumBytes( NumBytes ),
    m_ui8Padding( 0 )
{
    m_ui16SmpTyp = SampleType;
    m_ui16DtRep = Type0;

    for( KUINT16 i = 0; i < m_ui16NumBytes; ++i )
    {
        m_vui8DataVals.push_back( Data[i] );
    }
}